

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test0.cpp
# Opt level: O3

bool Create_OP_x64_push_pop(JitFuncCreater *jfc,Regs *regs)

{
  byte bVar1;
  byte *pbVar2;
  size_t in_RCX;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *__range1;
  byte *pbVar3;
  bool bVar4;
  undefined4 local_2c;
  
  pbVar2 = (regs->rq).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (pbVar3 = (regs->rq).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                .super__Vector_impl_data._M_start; pbVar3 != pbVar2; pbVar3 = pbVar3 + 1) {
    bVar1 = *pbVar3;
    bVar4 = (bVar1 & 0xf0) == 0x40;
    in_RCX = (size_t)(bVar4 || bVar1 < 0x10);
    if (!bVar4 && bVar1 >= 0x10) goto LAB_0010dadc;
    JitFFI::OpCode_x64::_push_pop_base<(unsigned_char)255,(unsigned_char)80,(unsigned_char)48>
              (jfc,(uint)bVar1);
  }
  pbVar2 = (regs->prq).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (pbVar3 = (regs->prq).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_start; pbVar3 != pbVar2; pbVar3 = pbVar3 + 1) {
    bVar1 = *pbVar3;
    bVar4 = (bVar1 & 0xf0) == 0x40;
    in_RCX = (size_t)(bVar4 || bVar1 < 0x10);
    if (!bVar4 && bVar1 >= 0x10) {
LAB_0010dadc:
      __assert_fail("is_rxq(src) || is_prxq(src)",
                    "/workspace/llm4binary/github/license_c_cmakelists/CVM-Projects[P]JitFFI/include/opcode.h"
                    ,0x1e0,"void JitFFI::OpCode_x64::push(JitFuncCreater &, Register)");
    }
    JitFFI::OpCode_x64::_push_pop_base<(unsigned_char)255,(unsigned_char)80,(unsigned_char)48>
              (jfc,(uint)bVar1);
  }
  pbVar2 = (regs->rq).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (pbVar3 = (regs->rq).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                .super__Vector_impl_data._M_start; pbVar3 != pbVar2; pbVar3 = pbVar3 + 1) {
    bVar1 = *pbVar3;
    bVar4 = (bVar1 & 0xf0) == 0x40;
    in_RCX = (size_t)(bVar4 || bVar1 < 0x10);
    if (!bVar4 && bVar1 >= 0x10) goto LAB_0010dafb;
    JitFFI::OpCode_x64::_push_pop_base<(unsigned_char)143,(unsigned_char)88,(unsigned_char)0>
              (jfc,(uint)bVar1);
  }
  pbVar3 = (regs->prq).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  pbVar2 = (regs->prq).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_finish;
  while( true ) {
    if (pbVar3 == pbVar2) {
      JitFFI::JitFuncCreater::push(jfc,0xff);
      JitFFI::JitFuncCreater::push(jfc,'p');
      JitFFI::JitFuncCreater::push(jfc,'\x05');
      JitFFI::JitFuncCreater::push(jfc,'A');
      JitFFI::JitFuncCreater::push(jfc,0xff);
      JitFFI::JitFuncCreater::push(jfc,'p');
      JitFFI::JitFuncCreater::push(jfc,'\x05');
      JitFFI::JitFuncCreater::push(jfc,0xff);
      JitFFI::JitFuncCreater::push(jfc,0xb0);
      local_2c = 5;
      JitFFI::JitFuncCreater::write(jfc,(int)&local_2c,(void *)0x4,in_RCX);
      JitFFI::JitFuncCreater::push(jfc,'A');
      JitFFI::JitFuncCreater::push(jfc,0xff);
      JitFFI::JitFuncCreater::push(jfc,0xb0);
      local_2c = 5;
      JitFFI::JitFuncCreater::write(jfc,(int)&local_2c,(void *)0x4,in_RCX);
      JitFFI::JitFuncCreater::push(jfc,0x8f);
      JitFFI::JitFuncCreater::push(jfc,'@');
      JitFFI::JitFuncCreater::push(jfc,'\x05');
      JitFFI::JitFuncCreater::push(jfc,'A');
      JitFFI::JitFuncCreater::push(jfc,0x8f);
      JitFFI::JitFuncCreater::push(jfc,'@');
      JitFFI::JitFuncCreater::push(jfc,'\x05');
      JitFFI::JitFuncCreater::push(jfc,0x8f);
      JitFFI::JitFuncCreater::push(jfc,0x80);
      local_2c = 5;
      JitFFI::JitFuncCreater::write(jfc,(int)&local_2c,(void *)0x4,in_RCX);
      JitFFI::JitFuncCreater::push(jfc,'A');
      JitFFI::JitFuncCreater::push(jfc,0x8f);
      JitFFI::JitFuncCreater::push(jfc,0x80);
      local_2c = 5;
      JitFFI::JitFuncCreater::write(jfc,(int)&local_2c,(void *)0x4,in_RCX);
      return true;
    }
    bVar1 = *pbVar3;
    bVar4 = (bVar1 & 0xf0) == 0x40;
    in_RCX = (size_t)(bVar4 || bVar1 < 0x10);
    if (!bVar4 && bVar1 >= 0x10) break;
    JitFFI::OpCode_x64::_push_pop_base<(unsigned_char)143,(unsigned_char)88,(unsigned_char)0>
              (jfc,(uint)bVar1);
    pbVar3 = pbVar3 + 1;
  }
LAB_0010dafb:
  __assert_fail("is_rxq(src) || is_prxq(src)",
                "/workspace/llm4binary/github/license_c_cmakelists/CVM-Projects[P]JitFFI/include/opcode.h"
                ,0x1e5,"void JitFFI::OpCode_x64::pop(JitFuncCreater &, Register)");
}

Assistant:

bool Create_OP_x64_push_pop(JitFuncCreater &jfc, const Regs &regs)
{
	using namespace OpCode_x64;

	for (byte r : regs.rq)
		push(jfc, static_cast<Register>(r));

	for (byte r : regs.prq)
		push(jfc, static_cast<Register>(r));

	for (byte r : regs.rq)
		pop(jfc, static_cast<Register>(r));

	for (byte r : regs.prq)
		pop(jfc, static_cast<Register>(r));

	push_offset_byte(jfc, prax, 5);
	push_offset_byte(jfc, pr8, 5);
	push_offset_u32(jfc, prax, 5);
	push_offset_u32(jfc, pr8, 5);

	pop_offset_byte(jfc, prax, 5);
	pop_offset_byte(jfc, pr8, 5);
	pop_offset_u32(jfc, prax, 5);
	pop_offset_u32(jfc, pr8, 5);

    return true;
}